

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnType
          (BinaryReaderIR *this,Index index,Index param_count,Type *param_types,Index result_count,
          Type *result_types)

{
  char *__s;
  Offset OVar1;
  _Head_base<0UL,_wabt::FuncTypeModuleField_*,_false> _Var2;
  size_t sVar3;
  undefined1 auStack_68 [8];
  Location loc;
  _Head_base<0UL,_wabt::FuncTypeModuleField_*,_false> local_40;
  unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_> field;
  
  loc.filename.size_._0_4_ = 0;
  loc.filename.size_._4_4_ = 0;
  loc.field_1.field_0.line = 0;
  auStack_68 = (undefined1  [8])0x0;
  loc.filename.data_._0_4_ = 0;
  loc.filename.data_._4_4_ = 0;
  __s = this->filename_;
  loc.field_1.field_0.last_column = param_count;
  loc.field_1._12_4_ = result_count;
  sVar3 = strlen(__s);
  loc.filename.data_._0_4_ = (undefined4)sVar3;
  loc.filename.data_._4_4_ = (undefined4)(sVar3 >> 0x20);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.filename.size_._0_4_ = (undefined4)OVar1;
  loc.filename.size_._4_4_ = (undefined4)(OVar1 >> 0x20);
  auStack_68 = (undefined1  [8])__s;
  MakeUnique<wabt::FuncTypeModuleField,wabt::Location>((wabt *)&local_40,(Location *)auStack_68);
  _Var2._M_head_impl = local_40._M_head_impl;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)
             ((long)&(local_40._M_head_impl)->func_type + 0x20),param_types,
             param_types + (uint)loc.field_1.field_0.last_column);
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)
             ((long)&(_Var2._M_head_impl)->func_type + 0x38),result_types,
             result_types + (uint)loc.field_1._12_4_);
  field._M_t.
  super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
  .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>,_true,_true>
        )(__uniq_ptr_data<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>,_true,_true>
          )local_40._M_head_impl;
  local_40._M_head_impl = (FuncTypeModuleField *)0x0;
  Module::AppendField(this->module_,&field);
  if ((__uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>)
      field._M_t.
      super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
      .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>)
      0x0) {
    (**(code **)(*(long *)field._M_t.
                          super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
                          .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl +
                8))();
  }
  field._M_t.
  super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
  .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>,_true,_true>
        )(__uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
          )0x0;
  if (local_40._M_head_impl != (FuncTypeModuleField *)0x0) {
    (**(code **)(*(long *)local_40._M_head_impl + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnType(Index index,
                              Index param_count,
                              Type* param_types,
                              Index result_count,
                              Type* result_types) {
  auto field = MakeUnique<FuncTypeModuleField>(GetLocation());
  FuncType& func_type = field->func_type;
  func_type.sig.param_types.assign(param_types, param_types + param_count);
  func_type.sig.result_types.assign(result_types, result_types + result_count);
  module_->AppendField(std::move(field));
  return Result::Ok;
}